

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O3

int insert_between(ll_head *q_head,ll_elem *n,ll_elem *p,ll_elem *s)

{
  elem_ptr_t *peVar1;
  atomic_size_t *paVar2;
  long *plVar3;
  long lVar4;
  atomic_size_t aVar5;
  elem_ptr_t eVar6;
  ulong uVar7;
  ulong uVar8;
  elem_ptr_t eVar9;
  ll_elem *plVar10;
  ll_elem *plVar11;
  ll_elem *plVar12;
  ll_elem *plVar13;
  bool bVar14;
  
  if (((ulong)q_head & 3) != 0) {
    __assert_fail("q == ptr_clear(q)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x1c7,
                  "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                 );
  }
  plVar12 = (ll_elem *)((ulong)n & 0xfffffffffffffffc);
  if (plVar12 != n) {
    __assert_fail("n == ptr_clear(n)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x1c8,
                  "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                 );
  }
  plVar10 = (ll_elem *)((ulong)p & 0xfffffffffffffffc);
  if (plVar10 != p) {
    __assert_fail("p == ptr_clear(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x1c9,
                  "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                 );
  }
  plVar11 = (ll_elem *)((ulong)s & 0xfffffffffffffffc);
  if (plVar11 != s) {
    __assert_fail("s == ptr_clear(s)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x1ca,
                  "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                 );
  }
  if (3 < n->pred) {
    __assert_fail("ptr_clear((struct ll_elem*)atomic_load_explicit(&n->pred, memory_order_relaxed)) == NULL"
                  ,"/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x1cd
                  ,
                  "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                 );
  }
  if (n->succ != 2) {
    __assert_fail("atomic_load_explicit(&n->succ, memory_order_relaxed) == FLAGGED",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x1ce,
                  "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                 );
  }
  if (n->refcnt == 0) {
    __assert_fail("atomic_load_explicit(&n->refcnt, memory_order_relaxed) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x1cf,
                  "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                 );
  }
  peVar1 = &n->pred;
  do {
  } while (*peVar1 != 0);
  LOCK();
  plVar10->refcnt = plVar10->refcnt + 1;
  UNLOCK();
  LOCK();
  plVar11->refcnt = plVar11->refcnt + 1;
  UNLOCK();
  while( true ) {
    LOCK();
    uVar8 = n->succ;
    bVar14 = uVar8 == 2;
    if (bVar14) {
      n->succ = (ulong)s | 3;
      uVar8 = 2;
    }
    UNLOCK();
    if (bVar14) break;
    if ((uVar8 & 0xfffffffffffffffe) != 2) {
      __assert_fail("cas",
                    "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                    0x1e3,
                    "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                   );
    }
  }
  LOCK();
  uVar8 = n->succ;
  n->succ = n->succ & 0xfffffffffffffffe;
  UNLOCK();
  if ((uVar8 & 1) != 0) {
    while( true ) {
      LOCK();
      uVar8 = *peVar1;
      bVar14 = uVar8 == 0;
      if (bVar14) {
        *peVar1 = (ulong)plVar10 | 1;
        uVar8 = 0;
      }
      UNLOCK();
      if (bVar14) break;
      if (1 < uVar8) {
        __assert_fail("cas",
                      "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                      0x1e8,
                      "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                     );
      }
    }
    LOCK();
    uVar8 = *peVar1;
    *peVar1 = *peVar1 & 0xfffffffffffffffe;
    UNLOCK();
    if ((uVar8 & 1) == 0) goto LAB_001024c4;
    uVar8 = (ulong)s | 2;
    eVar9 = p->succ;
    do {
      LOCK();
      eVar6 = p->succ;
      bVar14 = eVar9 == eVar6;
      if (bVar14) {
        p->succ = eVar9 | 1;
        eVar6 = eVar9;
      }
      UNLOCK();
      eVar9 = eVar6;
    } while (!bVar14);
    while ((eVar6 & 1) != 0) {
      eVar9 = p->succ;
      do {
        LOCK();
        eVar6 = p->succ;
        bVar14 = eVar9 == eVar6;
        if (bVar14) {
          p->succ = eVar9 | 1;
          eVar6 = eVar9;
        }
        UNLOCK();
        eVar9 = eVar6;
      } while (!bVar14);
    }
    plVar13 = (ll_elem *)(eVar6 & 0xfffffffffffffffc);
    if (plVar13 != (ll_elem *)0x0) {
      LOCK();
      plVar13->refcnt = plVar13->refcnt + 1;
      UNLOCK();
    }
    LOCK();
    uVar7 = p->succ;
    p->succ = p->succ & 0xfffffffffffffffe;
    UNLOCK();
    if ((uVar7 & 1) == 0) {
      __assert_fail("old & DEREF",
                    "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0xb0
                    ,"struct ll_elem *deref(elem_ptr_t *)");
    }
    if ((plVar13 == plVar11) && ((plVar10->pred & 2) == 0)) {
      if ((eVar6 & 1) != 0) goto LAB_00102502;
      do {
        LOCK();
        uVar7 = p->succ;
        bVar14 = eVar6 == uVar7;
        if (bVar14) {
          p->succ = (long)&plVar12->succ + (ulong)((uint)eVar6 & 2) + 1;
          uVar7 = eVar6;
        }
        UNLOCK();
        if (bVar14) {
          if ((plVar10->pred & 2) == 0) {
            LOCK();
            plVar12->refcnt = plVar12->refcnt + 1;
            UNLOCK();
            LOCK();
            uVar8 = p->succ;
            p->succ = p->succ & 0xfffffffffffffffe;
            UNLOCK();
            if ((uVar8 & 1) == 0) goto LAB_001024c4;
            LOCK();
            paVar2 = &plVar13->refcnt;
            uVar8 = *paVar2;
            *paVar2 = *paVar2 - 2;
            UNLOCK();
            if (1 < uVar8) {
              plVar12 = pred(q_head,s);
              LOCK();
              plVar3 = (long *)(((ulong)plVar12 & 0xfffffffffffffffc) + 0x10);
              lVar4 = *plVar3;
              *plVar3 = *plVar3 + -1;
              UNLOCK();
              if (lVar4 != 0) {
                LOCK();
                q_head->size = q_head->size + 1;
                UNLOCK();
                LOCK();
                n->succ = n->succ & 0xfffffffffffffffd;
                UNLOCK();
                return 1;
              }
            }
            goto LAB_001024e3;
          }
          LOCK();
          uVar7 = p->succ;
          p->succ = eVar6;
          UNLOCK();
          if ((ll_elem *)(uVar7 & 0xfffffffffffffffc) != n) {
            __assert_fail("(tmp & ~(FLAGGED | DEREF)) == (uintptr_t)n",
                          "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c"
                          ,0x209,
                          "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                         );
          }
          if ((uVar7 & 1) == 0) {
            __assert_fail("tmp & DEREF",
                          "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c"
                          ,0x20a,
                          "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                         );
          }
          break;
        }
      } while ((uVar7 & 0xfffffffffffffffe) == eVar6);
    }
    if (((ulong)s & 1) != 0) {
LAB_00102502:
      __assert_fail("!((uintptr_t)old & DEREF)",
                    "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0xdb
                    ,"int ptr_cas(elem_ptr_t *, struct ll_elem **, struct ll_elem *)");
    }
    while( true ) {
      LOCK();
      uVar7 = n->succ;
      bVar14 = uVar8 == uVar7;
      if (bVar14) {
        n->succ = 3;
        uVar7 = uVar8;
      }
      UNLOCK();
      if (bVar14) break;
      if ((uVar7 & 0xfffffffffffffffe) != uVar8) {
        __assert_fail("cas",
                      "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                      0x223,
                      "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                     );
      }
    }
    LOCK();
    uVar8 = n->succ;
    n->succ = n->succ & 0xfffffffffffffffe;
    UNLOCK();
    if ((uVar8 & 1) != 0) {
      if (((ulong)p & 1) != 0) goto LAB_00102502;
      while( true ) {
        LOCK();
        plVar12 = (ll_elem *)*peVar1;
        bVar14 = p == plVar12;
        if (bVar14) {
          *peVar1 = (ulong)((uint)p & 2) + 1;
          plVar12 = p;
        }
        UNLOCK();
        if (bVar14) break;
        if ((ll_elem *)((ulong)plVar12 & 0xfffffffffffffffe) != p) {
          __assert_fail("cas",
                        "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                        0x229,
                        "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                       );
        }
      }
      LOCK();
      uVar8 = *peVar1;
      *peVar1 = *peVar1 & 0xfffffffffffffffe;
      UNLOCK();
      if ((uVar8 & 1) != 0) {
        LOCK();
        paVar2 = &plVar10->refcnt;
        aVar5 = *paVar2;
        *paVar2 = *paVar2 - 1;
        UNLOCK();
        if (aVar5 != 0) {
          LOCK();
          paVar2 = &plVar11->refcnt;
          aVar5 = *paVar2;
          *paVar2 = *paVar2 - 1;
          UNLOCK();
          if (aVar5 != 0) {
            LOCK();
            paVar2 = &plVar13->refcnt;
            aVar5 = *paVar2;
            *paVar2 = *paVar2 - 1;
            UNLOCK();
            if (aVar5 != 0) {
              return 0;
            }
          }
        }
LAB_001024e3:
        __assert_fail("old >= count",
                      "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                      0x9a,"void deref_release(struct ll_head *, struct ll_elem *, size_t)");
      }
    }
  }
LAB_001024c4:
  __assert_fail("p & DEREF",
                "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0xf5,
                "void ptr_clear_deref(elem_ptr_t *)");
}

Assistant:

static int
insert_between(struct ll_head *q_head, struct ll_elem *n,
    struct ll_elem *p, struct ll_elem *s)
{
	struct ll_elem	*q, *ps = NULL, *ps_, *old;
	int		 cas;

	q = &q_head->q;
	/* Check arguments. */
	assert(q == ptr_clear(q));
	assert(n == ptr_clear(n));
	assert(p == ptr_clear(p));
	assert(s == ptr_clear(s));
	/* Check initial state of n. */
	assert(ptr_clear((struct ll_elem*)atomic_load_explicit(&n->pred,
	    memory_order_relaxed)) == NULL);
	assert(atomic_load_explicit(&n->succ, memory_order_relaxed) == FLAGGED);
	assert(atomic_load_explicit(&n->refcnt, memory_order_relaxed) > 0);
	/*
	 * Give unlink_release() time to update n->pred.
	 * XXX try and make this an aid function?
	 */
	while (atomic_load_explicit(&n->pred, memory_order_relaxed) != 0)
		SPINWAIT();

	/*
	 * Assign n->pred, n->succ.
	 *
	 * We add a flag to s, to prevent deletion operations from starting
	 * before we are ready.
	 */
	deref_acquire(p, 1);	/* Because n->pred = p. */
	deref_acquire(s, 1);	/* Because n->succ = s. */

	old = (struct ll_elem*)FLAGGED;
	cas = ptr_cas(&n->succ, &old,
	    (struct ll_elem*)((uintptr_t)s | FLAGGED));
	assert(cas);
	ptr_clear_deref(&n->succ);

	old = NULL;
	cas = ptr_cas(&n->pred, &old, p);
	assert(cas);
	ptr_clear_deref(&n->pred);

	/* Load bits in p->succ. */
	ps = deref(&p->succ);
	if (ptr_clear(ps) != ptr_clear(s) || deleted(p))
		goto fail;

	/* Exchange p->succ from s to n. */
	ps_ = ps;
	if (!ptr_cas(&p->succ, &ps_, n))
		goto fail;
	/*
	 * If p is not deleted at this moment, the link is succesful
	 * (since a non-deleted p means p is reachable from q and
	 * our update changed n to be reachable from p,
	 * hence it's reachable from q).
	 *
	 * Note that we hold the DEREF on ps->succ, so it cannot change.
	 *
	 * Also, note that we do not care if s has the deleted bit set:
	 * if it is being deleted, its deletor would have to update
	 * p->succ as well; we simply won the race to do that.
	 */
	if (deleted(p)) {
		uintptr_t	 tmp;

		/*
		 * Restore old value, note that this operation also clears
		 * the deref bit, since ps_ will not have that set.
		 */
		tmp = atomic_exchange_explicit(&p->succ, (uintptr_t)ps_,
		    memory_order_release);
		assert((tmp & ~(FLAGGED | DEREF)) == (uintptr_t)n);
		assert(tmp & DEREF);
		goto fail;
	}

	/* Update succesful.  Update deref counter on n and release p->succ. */
	deref_acquire(n, 1);
	ptr_clear_deref(&p->succ);
	/* Forget ps. */
	deref_release(q_head, ps, 2);	/* Once for ps, once for p->succ. */
	ps = NULL;

	/* Fix pred pointer of s. */
	deref_release(q_head, pred(q_head, s), 1);

	/* Update list size. */
	atomic_fetch_add_explicit(&q_head->size, 1, memory_order_relaxed);
	/* Clear delete block. */
	atomic_fetch_and_explicit(&n->succ, ~FLAGGED, memory_order_release);

	return 1;

fail:
	/* Undo setting n->succ. */
	old = (struct ll_elem*)((uintptr_t)s | FLAGGED);
	cas = ptr_cas(&n->succ, &old, (struct ll_elem*)FLAGGED);
	assert(cas);
	ptr_clear_deref(&n->succ);

	/* Undo setting n->pred. */
	old = p;
	cas = ptr_cas(&n->pred, &old, NULL);
	assert(cas);
	ptr_clear_deref(&n->pred);

	deref_release(q_head, p, 1);
	deref_release(q_head, s, 1);
	deref_release(q_head, ps, 1);
	return 0;
}